

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O2

void * internal_find_add(storage_blocks *sb,string_struct *r,uint8_t prev_bytes,char *s,int doadd)

{
  size_t *psVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  string_struct *psVar5;
  size_t sVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  byte *pbVar14;
  uint local_4c;
  char *local_48;
  
  local_4c = (uint)prev_bytes;
  local_48 = s;
  while( true ) {
    sVar9 = r->child_count;
    uVar13 = 0;
    sVar12 = sVar9;
    while (uVar10 = sVar12, uVar13 < uVar10) {
      sVar12 = uVar10 + uVar13 >> 1;
      pbVar14 = (byte *)r->children[sVar12].value;
      iVar4 = strcmp(local_48,(char *)(pbVar14 + sb->user_data_size + 1));
      bVar2 = *pbVar14;
      if ((iVar4 == 0) && (bVar2 == (byte)local_4c)) goto LAB_00101531;
      bVar3 = iVar4 < 0;
      if (bVar2 != (byte)local_4c) {
        bVar3 = bVar2 < (byte)local_4c;
      }
      if (!bVar3) {
        uVar13 = sVar12 + 1;
        sVar12 = uVar10;
      }
    }
    if (uVar13 == 0) break;
    for (uVar10 = 0;
        (local_48[uVar10] != '\0' &&
        (local_48[uVar10] == r->children[uVar13 - 1].value[uVar10 + sb->user_data_size + 1]));
        uVar10 = uVar10 + 1) {
    }
    if ((uVar10 & 0xff) < 9) break;
    local_4c = (local_4c & 0xff) + (int)uVar10;
    local_48 = local_48 + (uVar10 & 0xff);
    r = r->children + (uVar13 - 1);
  }
  if (doadd != 0) {
    psVar5 = (string_struct *)allocate_reallocate_array(r->children,sVar9,0x18);
    r->children = psVar5;
    if (psVar5 != (string_struct *)0x0) {
      lVar11 = r->child_count - uVar13;
      if (lVar11 != 0) {
        memmove(psVar5 + uVar13 + 1,psVar5 + uVar13,lVar11 * 0x18);
      }
      sVar6 = strlen(local_48);
      pcVar7 = sb->current;
      if ((pcVar7 == (char *)0x0) ||
         (sVar9 = sb->used_bytes, 0x1000 < sVar9 + sVar6 + 2 + sb->user_data_size)) {
        pcVar7 = (char *)calloc(1,0x1000);
        ppcVar8 = (char **)allocate_reallocate_array(sb->blocks,sb->block_count,8);
        sb->blocks = ppcVar8;
        if (ppcVar8 == (char **)0x0) {
          return (void *)0x0;
        }
        sVar9 = sb->block_count;
        sb->block_count = sVar9 + 1;
        ppcVar8[sVar9] = pcVar7;
        sb->current = pcVar7;
        sb->used_bytes = 0;
        sVar9 = 0;
      }
      psVar5 = r->children;
      psVar5[uVar13].value = pcVar7 + sVar9;
      psVar1 = &psVar5[uVar13].child_count;
      *psVar1 = 0;
      psVar1[1] = 0;
      pcVar7[sVar9] = (byte)local_4c;
      memcpy(pcVar7 + sVar9 + sb->user_data_size + 1,local_48,sVar6 + 1);
      sb->used_bytes = sb->used_bytes + sVar6 + 2 + sb->user_data_size;
      r->child_count = r->child_count + 1;
      pbVar14 = (byte *)r->children[uVar13].value;
LAB_00101531:
      return pbVar14 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *internal_find_add(storage_blocks *sb, struct string_struct *r, uint8_t prev_bytes, const char *s, int doadd)
{
	size_t begin = 0;
	size_t end = r->child_count;
	uint8_t common_bytes = 0;
	size_t len;
	char *newvalue;

	while (begin < end)
	{
		size_t mid = (begin + end) >> 1;
		int res = strcmp(s, r->children[mid].value + sb->user_data_size + 1);
		unsigned char sz_p1 = *(r->children[mid].value);
		if ((res == 0) && (sz_p1 == prev_bytes))
		{
			return (void*)(r->children[mid].value + 1);
		}
		else if (sz_p1 == prev_bytes)
		{
			if (res < 0) end = mid; else begin = mid + 1;
		}
		else
		{
			if (sz_p1 < prev_bytes) end = mid; else begin = mid + 1;
		}
	}

	/* 2. check how many bytes common with previous string */
	if (begin != 0) common_bytes = get_common_prefix_size(s, r->children[begin - 1].value + sb->user_data_size + 1);

	if (common_bytes > 8)
	{
		return internal_find_add(sb, &r->children[begin - 1], prev_bytes + common_bytes, s + common_bytes, doadd);
	}

	if (doadd == 0) return 0;

	/* 3. insert string after begin */
	r->children = allocate_reallocate_array(r->children, r->child_count, sizeof(struct string_struct));
	if (r->children == 0) return 0;
	if (begin != r->child_count)
	{
		memmove(&r->children[begin + 1], &r->children[begin],
		  (r->child_count - begin) * sizeof(struct string_struct));
	}

	len = strlen(s) + 1;
	if ((sb->current == 0) || (sb->used_bytes + 1 + len + sb->user_data_size > STORAGE_BLOCK_SIZE))
	{
		char *newcurrent = (char*)calloc(1, STORAGE_BLOCK_SIZE);
		sb->blocks = allocate_reallocate_array(sb->blocks, sb->block_count, sizeof(char*));
		if (sb->blocks == 0) return 0;

		sb->blocks[sb->block_count++] = newcurrent;
		sb->current = newcurrent;
		sb->used_bytes = 0;
	}

	newvalue = sb->current + sb->used_bytes;
	r->children[begin].value = newvalue;
	r->children[begin].child_count = 0;
	r->children[begin].children = 0;
	*(uint8_t*)(newvalue) = prev_bytes;
	memcpy(newvalue + sb->user_data_size + 1, s, len);
	sb->used_bytes += sb->user_data_size + 1 + len;
	r->child_count++;
	return (void*)(r->children[begin].value + 1);
}